

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

string * __thiscall
wabt::(anonymous_namespace)::BinaryReaderObjdumpDisassemble::BlockSigToString_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Type type)

{
  bool bVar1;
  Index IVar2;
  allocator<char> local_29;
  BinaryReaderObjdumpDisassemble *local_28;
  void *local_20;
  BinaryReaderObjdumpDisassemble *this_local;
  Type type_local;
  
  local_20 = this;
  this_local = (BinaryReaderObjdumpDisassemble *)type;
  type_local = (Type)__return_storage_ptr__;
  bVar1 = Type::IsIndex((Type *)&this_local);
  if (bVar1) {
    IVar2 = Type::GetIndex((Type *)&this_local);
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"type[%d]",(ulong)IVar2);
  }
  else {
    local_28 = this_local;
    bVar1 = operator==((Type)this_local,Void);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",&local_29);
      std::allocator<char>::~allocator(&local_29);
    }
    else {
      Type::GetName_abi_cxx11_(__return_storage_ptr__,(Type *)&this_local);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BinaryReaderObjdumpDisassemble::BlockSigToString(Type type) const {
  if (type.IsIndex()) {
    return StringPrintf("type[%d]", type.GetIndex());
  } else if (type == Type::Void) {
    return "";
  } else {
    return type.GetName();
  }
}